

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O2

UINT8 Audio_Deinit(void)

{
  UINT32 *pUVar1;
  ADRV_INSTANCE *pAVar2;
  byte bVar3;
  UINT32 UVar4;
  UINT8 UVar5;
  long lVar6;
  ulong uVar7;
  
  UVar5 = '\x18';
  if (isInit == '\x01') {
    lVar6 = 0x38;
    bVar3 = runDevCount;
    for (uVar7 = 0; (pAVar2 = runDevices, (bVar3 & 1) != 0 && (uVar7 < 0x10)); uVar7 = uVar7 + 1) {
      if (*(int *)((long)runDevices + lVar6 + -0x38) == -1) {
        bVar3 = 1;
      }
      else {
        pUVar1 = &runDevices->ID;
        (**(code **)(*(long *)((long)runDevices + lVar6 + -0x30) + 0x50))
                  (*(undefined8 *)((long)runDevices + lVar6 + -0x18));
        (**(code **)(*(long *)((long)pAVar2 + lVar6 + -0x30) + 0x40))
                  (*(undefined8 *)((long)pAVar2 + lVar6 + -0x18));
        ADrvLst_Clear((ADRV_LIST **)((long)pUVar1 + lVar6));
        bVar3 = runDevCount;
      }
      lVar6 = lVar6 + 0x48;
    }
    lVar6 = 8;
    UVar4 = audDrvCount;
    for (uVar7 = 0; uVar7 < UVar4; uVar7 = uVar7 + 1) {
      if ((*(byte *)((long)audDrvLoaded + lVar6 + -8) & 2) != 0) {
        (**(code **)(*(long *)(&audDrvLoaded->flags + lVar6) + 0x20))();
        UVar4 = audDrvCount;
      }
      lVar6 = lVar6 + 0x10;
    }
    free(runDevices);
    runDevices = (ADRV_INSTANCE *)0x0;
    UVar5 = '\0';
    runDevCount = 0;
    free(audDrvLoaded);
    audDrvLoaded = (ADRV_LOAD *)0x0;
    audDrvCount = 0;
    isInit = '\0';
  }
  return UVar5;
}

Assistant:

UINT8 Audio_Deinit(void)
{
	UINT32 curDev;
	ADRV_INSTANCE* tempAIns;
	
	if (! isInit)
		return AERR_WASDONE;
	
	for (curDev = 0; curDev < runDevCount; curDev ++)
	{
		tempAIns = &runDevices[curDev];
		if (tempAIns->ID != ADID_UNUSED)
		{
			tempAIns->drvStruct->Stop(tempAIns->drvData);
			tempAIns->drvStruct->Destroy(tempAIns->drvData);
			ADrvLst_Clear(&tempAIns->forwardDrvs);
		}
	}
	for (curDev = 0; curDev < audDrvCount; curDev ++)
	{
		if (audDrvLoaded[curDev].flags & ADFLG_IS_INIT)
			audDrvLoaded[curDev].drvStruct->Deinit();
	}
	
	free(runDevices);	runDevices = NULL;
	runDevCount = 0;
	free(audDrvLoaded);	audDrvLoaded = NULL;
	audDrvCount = 0;
	
	isInit = false;
	return AERR_OK;
}